

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas-calc.c
# Opt level: O0

int parse_calculation_line(char *line,char *full_line)

{
  _Bool _Var1;
  borg_calculation *f_00;
  int i;
  borg_calculation *f;
  char *full_line_local;
  char *line_local;
  
  f_00 = (borg_calculation *)mem_zalloc(0x10);
  _Var1 = parse_calculation(f_00,line,full_line);
  if (_Var1) {
    calc_free(f_00);
    line_local._4_4_ = -1;
  }
  else {
    line_local._4_4_ = borg_array_add(&calculations,f_00);
    if (line_local._4_4_ == -1) {
      borg_formula_error(line,full_line,"calculation","** can\'t add to formula array");
    }
  }
  return line_local._4_4_;
}

Assistant:

int parse_calculation_line(char *line, const char *full_line)
{
    struct borg_calculation *f = mem_zalloc(sizeof(struct borg_calculation));
    if (parse_calculation(f, line, full_line)) {
        calc_free(f);
        f = NULL;
        return -1;
    }

    int i = borg_array_add(&calculations, f);
    if (i == -1)
        borg_formula_error(
            line, full_line, "calculation", "** can't add to formula array");
    return i;
}